

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_cpool_add(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  cpool *cpool_00;
  cpool *cpool;
  cpool_bundle *bundle;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bundle._4_4_ = CURLE_OK;
  cpool_00 = cpool_get_instance(data);
  if (cpool_00 == (cpool *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    if (cpool_00 != (cpool *)0x0) {
      if ((cpool_00->share != (Curl_share *)0x0) && ((cpool_00->share->specifier & 0x20) != 0)) {
        Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      cpool_00->field_0x68 = cpool_00->field_0x68 & 0xfe | 1;
    }
    cpool = (cpool *)cpool_find_bundle(cpool_00,conn);
    if ((cpool == (cpool *)0x0) &&
       (cpool = (cpool *)cpool_add_bundle(cpool_00,conn), cpool == (cpool *)0x0)) {
      bundle._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      cpool_bundle_add((cpool_bundle *)cpool,conn);
      lVar1 = cpool_00->next_connection_id;
      cpool_00->next_connection_id = lVar1 + 1;
      conn->connection_id = lVar1;
      cpool_00->num_conn = cpool_00->num_conn + 1;
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_multi.log_level)))) {
        Curl_trc_multi(data,"[CPOOL] added connection %ld. The cache now contains %zu members",
                       conn->connection_id,cpool_00->num_conn);
      }
    }
    if (((cpool_00 != (cpool *)0x0) &&
        (cpool_00->field_0x68 = cpool_00->field_0x68 & 0xfe, cpool_00->share != (Curl_share *)0x0))
       && ((cpool_00->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
    data_local._4_4_ = bundle._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_cpool_add(struct Curl_easy *data,
                        struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool, data);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  CURL_TRC_M(data, "[CPOOL] added connection %" FMT_OFF_T ". "
             "The cache now contains %zu members",
             conn->connection_id, cpool->num_conn);
out:
  CPOOL_UNLOCK(cpool, data);

  return result;
}